

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O2

void __thiscall
Clasp::DefaultUnfoundedCheck::forwardUnsource(DefaultUnfoundedCheck *this,BodyPtr *n,bool add)

{
  int iVar1;
  AtomData AVar2;
  BodyNode *pBVar3;
  NodeId *pNVar4;
  pointer pAVar5;
  ulong uVar6;
  uint *puVar7;
  NodeId aId;
  uint local_3c;
  VarVec *local_38;
  
  pBVar3 = n->node;
  iVar1 = *(int *)&(pBVar3->super_Node).field_0x4;
  pNVar4 = (pBVar3->super_Node).sep_;
  puVar7 = (pBVar3->super_Node).adj_;
  local_38 = &this->sourceQ_;
  do {
    if (puVar7 == pNVar4 + ((iVar1 << 3) >> 0x1f)) {
      return;
    }
    local_3c = *puVar7;
    uVar6 = (ulong)local_3c;
    if (uVar6 != 0) {
      if (((*(uint *)&(n->node->super_Node).field_0x4 ^
           *(uint *)&(this->graph_->atoms_).ebo_.buf[uVar6].super_Node.field_0x4) & 0xfffffff) != 0)
      {
        return;
      }
      pAVar5 = (this->atoms_).ebo_.buf;
      AVar2 = pAVar5[uVar6];
      if (((int)AVar2 < 0) && (((uint)AVar2 & 0x1fffffff) == n->id)) {
        pAVar5[uVar6] = (AtomData)((uint)AVar2 & 0x7fffffff);
        bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (local_38,&local_3c);
      }
      if ((add) && (((uint)(this->atoms_).ebo_.buf[local_3c] & 0x1fffffff) == n->id)) {
        pushTodo(this,local_3c);
      }
    }
    puVar7 = puVar7 + 1;
  } while( true );
}

Assistant:

void DefaultUnfoundedCheck::forwardUnsource(const BodyPtr& n, bool add) {
	for (const NodeId* x = n.node->heads_begin(), *end = n.node->heads_end(); x != end; ++x) {
		// Treat disjunctions as separate rules when it comes to source pointer propagation.
		// E.g. a | b :- B is (source) propagated as:
		// a :- B, and
		// b :- B
		if (*x != DependencyGraph::sentinel_atom) {
			NodeId aId = *x;
			if (graph_->getAtom(aId).scc != n.node->scc) {
				break;
			}
			if (atoms_[aId].hasSource() && atoms_[aId].watch() == n.id) {
				atoms_[aId].markSourceInvalid();
				sourceQ_.push_back(aId);
			}
			if (add && atoms_[aId].watch() == n.id) {
				pushTodo(aId);
			}
		}
	}
}